

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_tests.cpp
# Opt level: O2

void __thiscall
iu_AssertionTest_x_iutest_x_VariadicPred_Test::Body
          (iu_AssertionTest_x_iutest_x_VariadicPred_Test *this)

{
  AssertionResult iutest_ar;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  iutest::AssertPredVariadicHelper<bool(*)(int,int,int,int,int,int),int,int,int,int,int,int>
            (&iutest_ar,(iutest *)"PredTest6","0, 1, 2, 3, 4, 5",(char *)PredTest6,
             (_func_bool_int_int_int_int_int_int *)0x0,1,2,3,4,5,
             (int)iutest_ar.m_message._M_dataplus._M_p);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/pred_tests.cpp"
               ,0x45,(char *)CONCAT44(iutest_ar.m_message._M_dataplus._M_p._4_4_,
                                      (int)iutest_ar.m_message._M_dataplus._M_p));
    local_1c0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  else {
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest::AssertPredVariadicHelper<bool(*)(int,int,int,int,int,int),int,int,int,int,int,int>
              (&iutest_ar,(iutest *)"PredTest6","0, 1, 2, 3, 4, 5",(char *)PredTest6,
               (_func_bool_int_int_int_int_int_int *)0x0,1,2,3,4,5,
               (int)iutest_ar.m_message._M_dataplus._M_p);
    if (iutest_ar.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/pred_tests.cpp"
                 ,0x46,(char *)CONCAT44(iutest_ar.m_message._M_dataplus._M_p._4_4_,
                                        (int)iutest_ar.m_message._M_dataplus._M_p));
      local_1c0._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
      std::__cxx11::string::~string((string *)&local_1c0);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest::AssertPredVariadicHelper<bool(*)(int,int,int,int,int,int),int,int,int,int,int,int>
              (&iutest_ar,(iutest *)"PredTest6","0, 1, 2, 3, 4, 5",(char *)PredTest6,
               (_func_bool_int_int_int_int_int_int *)0x0,1,2,3,4,5,
               (int)iutest_ar.m_message._M_dataplus._M_p);
    if (iutest_ar.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/pred_tests.cpp"
                 ,0x47,(char *)CONCAT44(iutest_ar.m_message._M_dataplus._M_p._4_4_,
                                        (int)iutest_ar.m_message._M_dataplus._M_p));
      local_1c0._44_4_ = 0xffffffff;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
      std::__cxx11::string::~string((string *)&local_1c0);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest::AssertPredVariadicHelper<bool(*)(int,int,int,int,int,int),int,int,int,int,int,int>
              (&iutest_ar,(iutest *)"PredTest6","0, 1, 2, 3, 4, 5",(char *)PredTest6,
               (_func_bool_int_int_int_int_int_int *)0x0,1,2,3,4,5,
               (int)iutest_ar.m_message._M_dataplus._M_p);
    if (iutest_ar.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/pred_tests.cpp"
                 ,0x48,(char *)CONCAT44(iutest_ar.m_message._M_dataplus._M_p._4_4_,
                                        (int)iutest_ar.m_message._M_dataplus._M_p));
      local_1c0._44_4_ = 0xfffffffd;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
      std::__cxx11::string::~string((string *)&local_1c0);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
    }
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(AssertionTest, VariadicPred)
{
    IUTEST_ASSERT_PRED(PredTest6, 0, 1, 2, 3, 4, 5);
    IUTEST_EXPECT_PRED(PredTest6, 0, 1, 2, 3, 4, 5);
    IUTEST_INFORM_PRED(PredTest6, 0, 1, 2, 3, 4, 5);
    IUTEST_ASSUME_PRED(PredTest6, 0, 1, 2, 3, 4, 5);
}